

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  byte bVar1;
  double dVar2;
  pointer puVar3;
  ostream *poVar4;
  uint uVar5;
  int z;
  pointer puVar6;
  long lVar7;
  ulong uVar8;
  int p;
  pointer paVar9;
  long lVar10;
  int i;
  unsigned_long uVar11;
  bool bVar12;
  uint32_t x_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> wrt_offset;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  vector<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_> cache;
  vector<unsigned_long,_std::allocator<unsigned_long>_> poolsize;
  uint64_t sum;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets2;
  ifstream f;
  byte abStack_428 [488];
  fstream of;
  char local_230 [512];
  
  std::ifstream::ifstream(&f,"input",_S_bin);
  std::operator<<((ostream *)&std::cerr,"detect pool sizes...\t");
  _of = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&poolsize,0x20000,(value_type *)&of,(allocator_type *)&offsets);
  while ((abStack_428[*(long *)(_f + -0x18)] & 2) == 0) {
    std::istream::read((char *)&f,(long)&of);
    if ((abStack_428[*(long *)(_f + -0x18)] & 5) == 0) {
      poolsize.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[_of >> 0x10 & 0xffff] =
           poolsize.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[_of >> 0x10 & 0xffff] + 1;
    }
  }
  offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&offsets,0x20000);
  sum = 0;
  for (puVar6 = poolsize.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar6 != poolsize.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
    uVar11 = *puVar6;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&offsets,&sum);
    sum = sum + uVar11 * 4;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&offsets2,&offsets);
  dVar2 = relClockOffset();
  poVar4 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar4,"\n");
  std::operator<<((ostream *)&std::cerr,"write unsorted...\t");
  std::fstream::fstream(&of,"output",_S_trunc|_S_out|_S_in|_S_bin);
  cache.
  super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)cache.
                        super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&wrt_offset,0x20000,(value_type_conflict1 *)&cache,(allocator_type *)&x_1);
  cache.
  super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cache.
  super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cache.
  super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>::
  resize(&cache,0x20000);
  std::ios::clear((int)&f + (int)*(undefined8 *)(_f + -0x18));
  std::istream::seekg((long)&f,_S_beg);
  while ((abStack_428[*(long *)(_f + -0x18)] & 2) == 0) {
    std::istream::read((char *)&f,(long)&x_1);
    puVar3 = wrt_offset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((abStack_428[*(long *)(_f + -0x18)] & 5) == 0) {
      uVar5 = x_1 >> 0x10;
      paVar9 = cache.
               super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar5;
      bVar1 = wrt_offset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      if ((ulong)bVar1 == 0xff) {
        paVar9[1]._M_elems[0x10] = x_1;
        std::ostream::seekp(local_230,
                            offsets.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar5],0);
        std::ostream::write(local_230,(long)paVar9);
        offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] =
             offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar5] + 0x3bc;
        puVar3[uVar5] = '\0';
      }
      else {
        wrt_offset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] = bVar1 + 1;
        paVar9->_M_elems[bVar1] = x_1;
      }
    }
  }
  dVar2 = relClockOffset();
  poVar4 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar4,"\n");
  std::operator<<((ostream *)&std::cerr,"write remaining pools...\t");
  lVar7 = 0;
  for (lVar10 = 0;
      paVar9 = cache.
               super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start, lVar10 != 0x20000; lVar10 = lVar10 + 1) {
    if (wrt_offset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[lVar10] != '\0') {
      std::ostream::seekp(local_230,
                          offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar10],0);
      std::ostream::write(local_230,(long)paVar9->_M_elems + lVar7);
    }
    lVar7 = lVar7 + 0x3bc;
  }
  std::
  _Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>::
  ~_Vector_base(&cache.
                 super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
               );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&wrt_offset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  dVar2 = relClockOffset();
  poVar4 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar4,"\n");
  std::operator<<((ostream *)&std::cerr,"sort separate pools...\t");
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&offsets,&offsets2);
  lVar7 = 0;
  while( true ) {
    if (lVar7 == 0x20000) break;
    if (poolsize.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar7] < 0x20000) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&wrt_offset,0,
                 (allocator_type *)&cache);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&wrt_offset,
                 poolsize.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7]);
      std::istream::seekg((long)&of,
                          (_Ios_Seekdir)
                          offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar7]);
      std::istream::read((char *)&of,
                         (long)wrt_offset.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (wrt_offset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 wrt_offset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      std::ostream::seekp((long)local_230,
                          (_Ios_Seekdir)
                          offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar7]);
      std::ostream::write(local_230,
                          (long)wrt_offset.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&wrt_offset);
    }
    else {
      cache.
      super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&wrt_offset,0x20000,
                 (value_type *)&cache,(allocator_type *)&x_1);
      std::istream::seekg((long)&of,
                          (_Ios_Seekdir)
                          offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar7]);
      uVar11 = poolsize.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7];
      while (bVar12 = uVar11 != 0, uVar11 = uVar11 - 1, bVar12) {
        std::istream::read((char *)&of,(long)&cache);
        *(long *)(wrt_offset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start +
                 (ulong)((uint)cache.
                               super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start & 0x1ffff) * 8) =
             *(long *)(wrt_offset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start +
                      (ulong)((uint)cache.
                                    super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0x1ffff) * 8) + 1;
      }
      std::ostream::seekp((long)local_230,
                          (_Ios_Seekdir)
                          offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar7]);
      for (lVar10 = 0; lVar10 != 0x20000; lVar10 = lVar10 + 1) {
        cache.
        super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(cache.
                               super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               (int)lVar7 << 0x10 | (uint)lVar10);
        for (uVar8 = 0;
            uVar8 < *(ulong *)(wrt_offset.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar10 * 8);
            uVar8 = uVar8 + 1) {
          std::ostream::write(local_230,(long)&cache);
        }
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&wrt_offset);
    }
    lVar7 = lVar7 + 1;
  }
  dVar2 = relClockOffset();
  poVar4 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar4,"\n");
  std::fstream::close();
  std::fstream::~fstream(&of);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&offsets2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&poolsize.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::ifstream::~ifstream(&f);
  return 0;
}

Assistant:

int main(){
    ifstream f("input", std::ios::binary);

    cerr << "detect pool sizes...\t";

    const size_t bits_per_pool = 16;
    const size_t pools_count = 2<<(32-bits_per_pool);
    vector<uint64_t> poolsize(pools_count, 0);

    while(!f.eof()) {
        uint32_t x;
        f.read((char*)&x, sizeof(x));
        if(f) {
            poolsize[x >> bits_per_pool]++;
        }
    }

    vector<uint64_t> offsets;
    offsets.reserve(pools_count);

    uint64_t sum=0;
    for(auto x: poolsize) {
        offsets.push_back(sum);
        sum+= x*4;
    }

    vector<uint64_t> offsets2(offsets);

    cerr << relClockOffset() << "\n";
    cerr << "write unsorted...\t";

    const uint64_t mem = 128'000'000 -
            pools_count*8 /*poolsize*/ -
            2*pools_count*4 /*offsets*/;

    //STAGE 2

    fstream of("output", std::ios::binary | std::ios::out | std::ios::in | std::ios::trunc);

    {
        vector<uint8_t> wrt_offset(pools_count, 0);

        const uint64_t mem2 = mem - pools_count*1 /*wrt_offset*/;

        const size_t max_line = mem2/pools_count/4; //256;
        vector<array<uint32_t, max_line> > cache;
        cache.resize(pools_count);

        f.clear();
        f.seekg(0, ios::beg);

        while (!f.eof()) {
            uint32_t x;
            f.read((char *) &x, sizeof(x));
            if (f) {
                size_t pool = x >> bits_per_pool;

                auto &cl = cache[pool];
                uint8_t &offs = wrt_offset[pool];
                if (offs == numeric_limits<uint8_t>::max()) {
                    cl[offs] = x;
                    of.seekp(offsets[pool]);
                    of.write((char *) &cl, 4 * max_line);
                    offsets[pool] += 4 * max_line;
                    offs = 0;
                } else {
                    cl[offs++] = x;
                }
            }
        }

        cerr << relClockOffset() << "\n";
        cerr << "write remaining pools...\t";

        for (int p = 0; p < pools_count; p++) {
            uint8_t offs = wrt_offset[p];
            if (offs > 0) {
                auto &cl = cache[p];
                of.seekp(offsets[p]);
                of.write((char *) &cl, 4 * (offs));
            }
        }
    }

    cerr << relClockOffset() << "\n";
    cerr << "sort separate pools...\t";

    //STAGE 3

    offsets = offsets2;
//    offsets2.clear();
//    offsets2.shrink_to_fit();
//    const size_t mem3 = mem - pools_count*4 /*offsets*/;

    for(size_t p =0;p<pools_count;p++) {
        if(poolsize[p] < 2<<bits_per_pool) {
            vector<uint32_t > arr(0);
            arr.resize(poolsize[p]);
            of.seekg(offsets[p], ios::beg);
            of.read((char*)arr.data(), arr.size()*4);
            sort(arr.begin(), arr.end());
            of.seekp(offsets[p], ios::beg);
            of.write((char*)arr.data(), arr.size()*4);
        } else {
            vector<uint64_t> cntsrt(2 << bits_per_pool, 0);
            of.seekg(offsets[p], ios::beg);
            size_t cnt = poolsize[p];
            for (int i = 0; i < cnt; i++) {
                uint32_t x;
                of.read((char *) &x, 4);
                cntsrt[x & ((2<<bits_per_pool)-1) ]++;
            }
            of.seekp(offsets[p], ios::beg);
            for (int i = 0; i < 2 << bits_per_pool; i++) {
                uint32_t x = (p << bits_per_pool) | i;
                for (int z = 0; z < cntsrt[i]; z++) {
                    of.write((char *) &x, 4);
                }
            }
        }
    }

    cerr << relClockOffset() << "\n";

    of.close();
}